

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdisplay.c
# Opt level: O2

void xdpy_flip_display(ALLEGRO_DISPLAY *d)

{
  _Bool _Var1;
  GLenum e;
  ALLEGRO_SYSTEM *pAVar2;
  char *pcVar3;
  
  pAVar2 = al_get_system_driver();
  e = glGetError();
  if (e != 0) {
    _Var1 = _al_trace_prefix("display",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/x/xdisplay.c"
                             ,0x343,"xdpy_flip_display");
    if (_Var1) {
      pcVar3 = _al_gl_error_string(e);
      _al_trace_suffix("OpenGL error was not 0: %s\n",pcVar3);
    }
  }
  if ((d->extra_settings).settings[0x16] != 0) {
    glFlush();
    return;
  }
  glXSwapBuffers(pAVar2[1].displays._itemsize,*(undefined8 *)(d[1].es.__pad + 6));
  return;
}

Assistant:

static void xdpy_flip_display(ALLEGRO_DISPLAY *d)
{
   ALLEGRO_SYSTEM_XGLX *system = (ALLEGRO_SYSTEM_XGLX *)al_get_system_driver();
   ALLEGRO_DISPLAY_XGLX *glx = (ALLEGRO_DISPLAY_XGLX *)d;

   int e = glGetError();
   if (e) {
      ALLEGRO_ERROR("OpenGL error was not 0: %s\n", _al_gl_error_string(e));
   }

   if (d->extra_settings.settings[ALLEGRO_SINGLE_BUFFER])
      glFlush();
   else
      glXSwapBuffers(system->gfxdisplay, glx->glxwindow);
}